

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
kratos::Simulator::eval_expr
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  undefined1 *this_00;
  ulong uVar1;
  value_type vVar2;
  uint64_t right_value_00;
  uint64_t uVar3;
  _func_int **pp_Var4;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  uint uVar5;
  bool bVar6;
  char cVar7;
  byte bVar8;
  VarType VVar9;
  int iVar10;
  uint uVar11;
  uint32_t uVar12;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *pvVar13;
  iterator __first;
  iterator __last;
  reference ppVVar14;
  unsigned_long *puVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  size_type sVar17;
  runtime_error *prVar18;
  reference pvVar19;
  optional<unsigned_long> oVar20;
  allocator<unsigned_long> local_2c1;
  uint64_t local_2c0;
  iterator local_2b8;
  size_type local_2b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  uint64_t local_290;
  uint64_t result_2;
  value_type left_value_1;
  uint64_t local_278;
  iterator local_270;
  size_type local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  uint64_t local_248;
  uint64_t result_1;
  value_type right_value;
  value_type left_value;
  uint64_t local_228;
  iterator local_220;
  size_type local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  uint64_t local_1f8;
  uint64_t result;
  undefined1 local_1e8 [7];
  bool c;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> predicate_val;
  ConditionalExpr *cond;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> right_val;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> left_val;
  ulong local_178;
  iterator local_170;
  size_type local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160;
  uint local_144;
  ulong uStack_140;
  uint32_t i;
  value_type v_1;
  undefined1 local_130 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> value_1;
  Var *base_var;
  VarExtend *extend;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *local_f8;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> **local_f0;
  size_type local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  undefined4 local_c8;
  _Storage<unsigned_long,_true> local_c0;
  optional<unsigned_long> v;
  Var *var_;
  iterator __end3;
  iterator __begin3;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range3;
  uint64_t value;
  uint32_t shift_amount;
  allocator<kratos::Var_*> local_59;
  __normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_58;
  __normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_50;
  undefined1 local_48 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  VarConcat *var_concat;
  Expr *expr;
  Var *var_local;
  Simulator *this_local;
  
  VVar9 = Var::type(var);
  if (VVar9 == Expression) {
    if (var[1].super_IRNode._vptr_IRNode == (_func_int **)0x1c) {
      vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)var;
      pvVar13 = VarConcat::vars((VarConcat *)var);
      local_50._M_current =
           (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin(pvVar13);
      pvVar13 = VarConcat::vars((VarConcat *)
                                vars.
                                super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_58._M_current =
           (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end(pvVar13);
      std::allocator<kratos::Var_*>::allocator(&local_59);
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
      vector<__gnu_cxx::__normal_iterator<kratos::Var*const*,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,void>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)local_48,local_50,local_58,
                 &local_59);
      std::allocator<kratos::Var_*>::~allocator(&local_59);
      __first = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                          ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_48);
      __last = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                         ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_48);
      std::
      reverse<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>>
                ((__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                  )__last._M_current);
      bVar8 = 0;
      __range3 = (vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)0x0;
      __end3 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                         ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_48);
      var_ = (Var *)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_48);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                                         *)&var_), bVar6) {
        ppVVar14 = __gnu_cxx::
                   __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                   ::operator*(&__end3);
        v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = *ppVVar14;
        oVar20 = get_value_(this,(Var *)v.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                        .super__Optional_payload_base<unsigned_long>._8_8_);
        local_c0._M_value =
             oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
             oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        bVar6 = std::optional::operator_cast_to_bool((optional *)&local_c0);
        if (!bVar6) {
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                    (__return_storage_ptr__);
          goto LAB_0036bb20;
        }
        puVar15 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_c0);
        __range3 = (vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)
                   ((ulong)__range3 | *puVar15 << (bVar8 & 0x3f));
        cVar7 = (**(code **)(*(long *)v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                      super__Optional_payload_base<unsigned_long>._8_8_ + 0x38))();
        bVar8 = cVar7 + bVar8;
        __gnu_cxx::
        __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
        ::operator++(&__end3);
      }
      local_f8 = __range3;
      local_f0 = &local_f8;
      local_e8 = 1;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&extend + 7));
      __l_03._M_len = local_e8;
      __l_03._M_array = (iterator)local_f0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_e0,__l_03,(allocator<unsigned_long> *)((long)&extend + 7));
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
      optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                (__return_storage_ptr__,&local_e0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_e0);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&extend + 7));
LAB_0036bb20:
      local_c8 = 1;
      std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~vector
                ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_48);
    }
    else if (var[1].super_IRNode._vptr_IRNode == (_func_int **)0x1d) {
      value_1.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _24_8_ = VarExtend::parent_var((VarExtend *)var);
      get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                         local_130,this,
                         (Var *)value_1.
                                super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                ._24_8_);
      bVar6 = std::optional::operator_cast_to_bool((optional *)local_130);
      if (bVar6) {
        bVar6 = Var::is_signed(var);
        if (bVar6) {
          pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                    operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)local_130);
          sVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar16);
          if (1 < sVar17) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar18,"Not implemented");
            __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                    operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)local_130);
          pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (pvVar16,0);
          uVar1 = *pvVar19;
          uStack_140 = uVar1;
          iVar10 = (*(var->super_IRNode)._vptr_IRNode[7])();
          if (uVar1 >> ((char)iVar10 - 1U & 0x3f) != 0) {
            for (local_144 = (**(code **)(*(long *)value_1.
                                                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  ._24_8_ + 0x38))(); uVar5 = local_144,
                uVar11 = (*(var->super_IRNode)._vptr_IRNode[7])(), uVar5 < uVar11;
                local_144 = local_144 + 1) {
              uStack_140 = (uint)(1 << ((byte)local_144 & 0x1f)) | uStack_140;
            }
          }
          local_178 = uStack_140;
          local_170 = &local_178;
          local_168 = 1;
          this_00 = &left_val.
                     super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     .field_0x1f;
          std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_00);
          __l_02._M_len = local_168;
          __l_02._M_array = local_170;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_160,__l_02,(allocator_type *)this_00);
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
          optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                    (__return_storage_ptr__,&local_160);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_160);
          std::allocator<unsigned_long>::~allocator
                    ((allocator<unsigned_long> *)
                     &left_val.
                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      .field_0x1f);
        }
        else {
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                    (__return_storage_ptr__,
                     (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     local_130);
        }
      }
      else {
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                  (__return_storage_ptr__);
      }
      local_c8 = 1;
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_130)
      ;
    }
    else {
      get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                         &right_val.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_engaged,this,
                         (Var *)var[1].super_IRNode.fn_name_ln.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      bVar6 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &right_val.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_engaged);
      if (bVar6) {
        get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                           &cond,this,
                           (Var *)var[1].super_IRNode.fn_name_ln.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        bVar6 = is_ternary_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
        if (bVar6) {
          predicate_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._24_8_ = var;
          get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)local_1e8,this,
                             (Var *)var[1].super_IRNode.fn_name_ln.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar6 = std::optional::operator_cast_to_bool((optional *)local_1e8);
          if (bVar6) {
            pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                      operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)local_1e8);
            pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (pvVar16,0);
            vVar2 = *pvVar19;
            result._7_1_ = vVar2 != 0;
            pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                      operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&right_val.
                                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    ._M_engaged);
            pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (pvVar16,0);
            uVar3 = *pvVar19;
            pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                      operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&cond);
            pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (pvVar16,0);
            right_value_00 = *pvVar19;
            uVar12 = (*(var->super_IRNode)._vptr_IRNode[7])();
            local_228 = eval_ternary_op(vVar2 != 0,uVar3,right_value_00,uVar12);
            local_220 = &local_228;
            local_218 = 1;
            local_1f8 = local_228;
            std::allocator<unsigned_long>::allocator
                      ((allocator<unsigned_long> *)((long)&left_value + 7));
            __l_01._M_len = local_218;
            __l_01._M_array = local_220;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_210,__l_01,(allocator<unsigned_long> *)((long)&left_value + 7));
            std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
            optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                      (__return_storage_ptr__,&local_210);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_210);
            std::allocator<unsigned_long>::~allocator
                      ((allocator<unsigned_long> *)((long)&left_value + 7));
          }
          else {
            std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                      (__return_storage_ptr__,
                       (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       &cond);
          }
          local_c8 = 1;
          std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                    ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     local_1e8);
        }
        else {
          bVar6 = is_unary_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
          if (bVar6) {
            pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                      operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&right_val.
                                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    ._M_engaged);
            pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (pvVar16,0);
            uVar3 = *pvVar19;
            pp_Var4 = var[1].super_IRNode._vptr_IRNode;
            result_2 = uVar3;
            uVar12 = (*(var->super_IRNode)._vptr_IRNode[7])();
            local_2c0 = eval_unary_op(uVar3,(ExprOp)pp_Var4,uVar12);
            local_2b8 = &local_2c0;
            local_2b0 = 1;
            local_290 = local_2c0;
            std::allocator<unsigned_long>::allocator(&local_2c1);
            __l._M_len = local_2b0;
            __l._M_array = local_2b8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_2a8,__l,&local_2c1);
            std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
            optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                      (__return_storage_ptr__,&local_2a8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2a8);
            std::allocator<unsigned_long>::~allocator(&local_2c1);
            local_c8 = 1;
          }
          else {
            bVar6 = std::optional::operator_cast_to_bool((optional *)&cond);
            if (bVar6) {
              pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                        operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&right_val.
                                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._M_engaged);
              sVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar16);
              if (1 < sVar17) {
                prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar18,"Not implemented");
                __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                        operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&cond);
              sVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar16);
              if (1 < sVar17) {
                prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar18,"Not implemented");
                __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                        operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&right_val.
                                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._M_engaged);
              pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (pvVar16,0);
              right_value = *pvVar19;
              pvVar16 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
                        operator*((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)&cond);
              pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (pvVar16,0);
              vVar2 = right_value;
              uVar3 = *pvVar19;
              pp_Var4 = var[1].super_IRNode._vptr_IRNode;
              result_1 = uVar3;
              uVar12 = (*(var->super_IRNode)._vptr_IRNode[7])();
              bVar6 = Var::is_signed(var);
              local_278 = eval_bin_op(vVar2,uVar3,(ExprOp)pp_Var4,uVar12,bVar6);
              local_270 = &local_278;
              local_268 = 1;
              local_248 = local_278;
              std::allocator<unsigned_long>::allocator
                        ((allocator<unsigned_long> *)((long)&left_value_1 + 7));
              __l_00._M_len = local_268;
              __l_00._M_array = local_270;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_260,__l_00,(allocator<unsigned_long> *)((long)&left_value_1 + 7));
              std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
              optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                        (__return_storage_ptr__,&local_260);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_260);
              std::allocator<unsigned_long>::~allocator
                        ((allocator<unsigned_long> *)((long)&left_value_1 + 7));
              local_c8 = 1;
            }
            else {
              std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                        (__return_storage_ptr__);
              local_c8 = 1;
            }
          }
        }
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                  ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&cond);
      }
      else {
        std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                  (__return_storage_ptr__,
                   (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   &right_val.
                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_engaged);
        local_c8 = 1;
      }
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
                ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 &right_val.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._M_engaged);
    }
  }
  else {
    get_complex_value_(__return_storage_ptr__,this,var);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<uint64_t>> Simulator::eval_expr(const kratos::Var *var) const {
    if (var->type() == VarType::Expression) {
        const auto *expr = reinterpret_cast<const Expr *>(var);
        // there are couple special ones
        if (expr->op == ExprOp::Concat) {
            const auto *var_concat = reinterpret_cast<const VarConcat *>(expr);
            auto vars = std::vector<Var *>(var_concat->vars().begin(), var_concat->vars().end());
            std::reverse(vars.begin(), vars.end());
            uint32_t shift_amount = 0;
            uint64_t value = 0;
            for (auto *var_ : vars) {
                auto v = get_value_(var_);
                if (v) {
                    value |= (*v) << shift_amount;
                    shift_amount += var_->width();
                } else {
                    return std::nullopt;
                }
            }
            return std::vector<uint64_t>{value};
        } else if (expr->op == ExprOp::Extend) {
            // depends on whether it's a signed value or not
            const auto *extend = reinterpret_cast<const VarExtend *>(var);
            auto *base_var = extend->parent_var();
            auto value = get_complex_value_(base_var);
            if (!value) return std::nullopt;
            if (var->is_signed()) {
                // do signed extension
                if ((*value).size() > 1) {
                    throw std::runtime_error("Not implemented");
                }
                auto v = (*value)[0];
                if (v >> (var->width() - 1)) {
                    // do a signed extension
                    for (uint32_t i = base_var->width(); i < var->width(); i++) {
                        v |= 1u << i;
                    }
                }
                return std::vector<uint64_t>{v};
            } else {
                return value;
            }
        } else {
            auto left_val = get_complex_value_(expr->left);
            if (!left_val) return left_val;
            auto right_val = get_complex_value_(expr->right);
            if (is_ternary_op(expr->op)) {
                auto const *cond = reinterpret_cast<const ConditionalExpr *>(expr);
                auto predicate_val = get_complex_value_(cond->condition);
                if (!predicate_val) return right_val;
                bool c = (*predicate_val)[0];
                auto result = eval_ternary_op(c, (*left_val)[0], (*right_val)[0], expr->width());
                return std::vector<uint64_t>{result};
            } else if (!is_unary_op(expr->op)) {
                if (!right_val) return std::nullopt;
                if ((*left_val).size() > 1) throw std::runtime_error("Not implemented");
                if ((*right_val).size() > 1) throw std::runtime_error("Not implemented");
                auto left_value = (*left_val)[0];
                auto right_value = (*right_val)[0];
                auto result = eval_bin_op(left_value, right_value, expr->op, expr->width(),
                                          expr->is_signed());
                return std::vector<uint64_t>{result};
            } else {
                auto left_value = (*left_val)[0];
                auto result = eval_unary_op(left_value, expr->op, expr->width());
                return std::vector<uint64_t>{result};
            }
        }

    } else {
        return get_complex_value_(var);
    }
}